

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O3

void iemgui_init_sym2dollararg(t_iemgui *iemgui,t_symbol **symp,int indx,t_symbol *fallback)

{
  int iVar1;
  t_atom *ptVar2;
  t_symbol *ptVar3;
  char *__s1;
  char astring [80];
  char acStack_78 [88];
  
  if (*symp != (t_symbol *)0x0) {
    return;
  }
  __s1 = acStack_78;
  iVar1 = binbuf_getnatom((_binbuf *)iemgui);
  if (indx < iVar1) {
    ptVar2 = binbuf_getvec((_binbuf *)iemgui);
    if (ptVar2[indx].a_type == A_SYMBOL) {
      ptVar3 = atom_getsymbol(ptVar2 + indx);
      __s1 = ptVar3->s_name;
    }
    else {
      atom_string(ptVar2 + indx,acStack_78,0x50);
    }
    iVar1 = strcmp(__s1,"empty");
    if (iVar1 != 0) {
      ptVar3 = gensym(__s1);
      *symp = ptVar3;
    }
  }
  if (*symp == (t_symbol *)0x0) {
    *symp = fallback;
  }
  return;
}

Assistant:

static void iemgui_init_sym2dollararg(t_iemgui *iemgui, t_symbol **symp,
    int indx, t_symbol *fallback)
{
    t_binbuf *b = iemgui->x_obj.ob_binbuf;
    if ((!*symp) && (binbuf_getnatom(b) > indx))
    {
        t_atom *a = binbuf_getvec(b) + indx;
        char astring[80];
        const char *buf = astring;
        if(A_SYMBOL == a->a_type)
        {
            buf = atom_getsymbol(a)->s_name;
        } else {
            atom_string(a, astring, sizeof(astring));
        }
        if(strcmp(buf, "empty"))
            *symp = gensym(buf);
    }
    if (!*symp)
        *symp = fallback;
}